

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse_fasta_digest.cpp
# Opt level: O3

void __thiscall argparse::args_t::parse_motif(args_t *this,char *str)

{
  size_t sVar1;
  char *__dest;
  
  sVar1 = strlen(str);
  if (3 < (int)sVar1) {
    __dest = (char *)malloc((ulong)((int)sVar1 + 1));
    this->motif_list = __dest;
    strcpy(__dest,str);
    return;
  }
  ERROR("motif list must be at least 4 characters long: %s",str);
  return;
}

Assistant:

void args_t::parse_motif ( const char * str  ) {
        const int L = strlen (str);
        if (L >= 4) {
            motif_list = (char*)malloc (L + 1);
            strcpy (motif_list, str);
        } else {
            ERROR( "motif list must be at least 4 characters long: %s", str );
        }
    }